

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

bool __thiscall MipsParser::parseVpfxdParameter(MipsParser *this,Parser *parser,int *result)

{
  TokenValueSequence values;
  TokenSequence tokens;
  TokenValueSequence values_00;
  TokenSequence tokens_00;
  TokenValueSequence values_01;
  TokenSequence tokens_01;
  TokenValueSequence values_02;
  TokenSequence tokens_02;
  TokenValueSequence values_03;
  TokenSequence tokens_03;
  TokenValueSequence values_04;
  TokenSequence tokens_04;
  TokenValueSequence values_05;
  TokenSequence tokens_05;
  TokenValueSequence values_06;
  TokenSequence tokens_06;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  Token *pTVar4;
  int local_2b0;
  int local_2ac;
  int num;
  int i;
  TokenSequenceValue TStack_298;
  iterator local_288;
  undefined8 local_280;
  TokenType local_278 [4];
  iterator local_268;
  size_type local_260;
  TokenSequenceValue local_258;
  TokenSequenceValue TStack_248;
  iterator local_238;
  undefined8 local_230;
  TokenType local_228 [4];
  iterator local_218;
  size_type local_210;
  TokenSequenceValue local_208;
  TokenSequenceValue TStack_1f8;
  iterator local_1e8;
  undefined8 local_1e0;
  TokenType local_1d8 [4];
  iterator local_1c8;
  size_type local_1c0;
  TokenSequenceValue local_1b8;
  TokenSequenceValue TStack_1a8;
  iterator local_198;
  undefined8 local_190;
  TokenType local_188 [4];
  iterator local_178;
  size_type local_170;
  TokenSequenceValue local_168;
  TokenSequenceValue TStack_158;
  iterator local_148;
  undefined8 local_140;
  TokenType local_134 [3];
  iterator local_128;
  size_type local_120;
  TokenSequenceValue local_118;
  TokenSequenceValue TStack_108;
  iterator local_f8;
  undefined8 local_f0;
  TokenType local_e4 [3];
  iterator local_d8;
  size_type local_d0;
  TokenSequenceValue local_c8;
  TokenSequenceValue TStack_b8;
  iterator local_a8;
  undefined8 local_a0;
  TokenType local_94 [3];
  iterator local_88;
  size_type local_80;
  TokenSequenceValue local_78;
  TokenSequenceValue TStack_68;
  iterator local_58;
  undefined8 local_50;
  TokenType local_44 [3];
  iterator local_38;
  size_type local_30;
  uint *local_28;
  int *result_local;
  Parser *parser_local;
  MipsParser *this_local;
  
  local_28 = (uint *)result;
  result_local = (int *)parser;
  parser_local = (Parser *)this;
  if ((parseVpfxdParameter(Parser&,int&)::sequenceParser == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parseVpfxdParameter(Parser&,int&)::sequenceParser), iVar2 != 0))
  {
    TokenSequenceParser::TokenSequenceParser(&parseVpfxdParameter::sequenceParser);
    __cxa_atexit(TokenSequenceParser::~TokenSequenceParser,&parseVpfxdParameter::sequenceParser,
                 &__dso_handle);
    __cxa_guard_release(&parseVpfxdParameter(Parser&,int&)::sequenceParser);
  }
  sVar3 = TokenSequenceParser::getEntryCount(&parseVpfxdParameter::sequenceParser);
  if (sVar3 == 0) {
    local_44[0] = Integer;
    local_44[1] = 8;
    local_44[2] = 2;
    local_38 = local_44;
    local_30 = 3;
    TokenSequenceValue::TokenSequenceValue(&local_78,0);
    TokenSequenceValue::TokenSequenceValue(&TStack_68,1);
    local_58 = &local_78;
    local_50 = 2;
    tokens_06._M_len = local_30;
    tokens_06._M_array = local_38;
    values_06._M_len = 2;
    values_06._M_array = local_58;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,1,tokens_06,values_06);
    local_94[0] = Integer;
    local_94[1] = 8;
    local_94[2] = 0x27;
    local_88 = local_94;
    local_80 = 3;
    TokenSequenceValue::TokenSequenceValue(&local_c8,0);
    TokenSequenceValue::TokenSequenceValue(&TStack_b8,"1m");
    local_a8 = &local_c8;
    local_a0 = 2;
    tokens_05._M_len = local_80;
    tokens_05._M_array = local_88;
    values_05._M_len = 2;
    values_05._M_array = local_a8;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,-1,tokens_05,values_05);
    local_e4[0] = Integer;
    local_e4[1] = 0x1c;
    local_e4[2] = 2;
    local_d8 = local_e4;
    local_d0 = 3;
    TokenSequenceValue::TokenSequenceValue(&local_118,0);
    TokenSequenceValue::TokenSequenceValue(&TStack_108,1);
    local_f8 = &local_118;
    local_f0 = 2;
    tokens_04._M_len = local_d0;
    tokens_04._M_array = local_d8;
    values_04._M_len = 2;
    values_04._M_array = local_f8;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,1,tokens_04,values_04);
    local_134[0] = Integer;
    local_134[1] = 0x1c;
    local_134[2] = 0x27;
    local_128 = local_134;
    local_120 = 3;
    TokenSequenceValue::TokenSequenceValue(&local_168,0);
    TokenSequenceValue::TokenSequenceValue(&TStack_158,"1m");
    local_148 = &local_168;
    local_140 = 2;
    tokens_03._M_len = local_120;
    tokens_03._M_array = local_128;
    values_03._M_len = 2;
    values_03._M_array = local_148;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,-1,tokens_03,values_03);
    local_188[0] = Minus;
    local_188[1] = 2;
    local_188[2] = 8;
    local_188[3] = 2;
    local_178 = local_188;
    local_170 = 4;
    TokenSequenceValue::TokenSequenceValue(&local_1b8,1);
    TokenSequenceValue::TokenSequenceValue(&TStack_1a8,1);
    local_198 = &local_1b8;
    local_190 = 2;
    tokens_02._M_len = local_170;
    tokens_02._M_array = local_178;
    values_02._M_len = 2;
    values_02._M_array = local_198;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,3,tokens_02,values_02);
    local_1d8[0] = Minus;
    local_1d8[1] = 2;
    local_1d8[2] = 8;
    local_1d8[3] = 0x27;
    local_1c8 = local_1d8;
    local_1c0 = 4;
    TokenSequenceValue::TokenSequenceValue(&local_208,1);
    TokenSequenceValue::TokenSequenceValue(&TStack_1f8,"1m");
    local_1e8 = &local_208;
    local_1e0 = 2;
    tokens_01._M_len = local_1c0;
    tokens_01._M_array = local_1c8;
    values_01._M_len = 2;
    values_01._M_array = local_1e8;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,-3,tokens_01,values_01);
    local_228[0] = Minus;
    local_228[1] = 2;
    local_228[2] = 0x1c;
    local_228[3] = 2;
    local_218 = local_228;
    local_210 = 4;
    TokenSequenceValue::TokenSequenceValue(&local_258,1);
    TokenSequenceValue::TokenSequenceValue(&TStack_248,1);
    local_238 = &local_258;
    local_230 = 2;
    tokens_00._M_len = local_210;
    tokens_00._M_array = local_218;
    values_00._M_len = 2;
    values_00._M_array = local_238;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,3,tokens_00,values_00);
    local_278[0] = Minus;
    local_278[1] = 2;
    local_278[2] = 0x1c;
    local_278[3] = 0x27;
    local_268 = local_278;
    local_260 = 4;
    TokenSequenceValue::TokenSequenceValue((TokenSequenceValue *)&num,1);
    TokenSequenceValue::TokenSequenceValue(&TStack_298,"1m");
    local_288 = (iterator)&num;
    local_280 = 2;
    tokens._M_len = local_260;
    tokens._M_array = local_268;
    values._M_len = 2;
    values._M_array = local_288;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,-3,tokens,values);
  }
  local_2ac = 0;
  while( true ) {
    if (3 < local_2ac) {
      pTVar4 = Parser::nextToken((Parser *)result_local);
      return pTVar4->type == RBrack;
    }
    if ((local_2ac != 0) &&
       (pTVar4 = Parser::nextToken((Parser *)result_local), pTVar4->type != Comma)) break;
    Parser::eatToken((Parser *)result_local);
    local_2b0 = 0;
    bVar1 = TokenSequenceParser::parse
                      (&parseVpfxdParameter::sequenceParser,(Parser *)result_local,&local_2b0);
    if (!bVar1) {
      return false;
    }
    if (local_2b0 < 0) {
      *local_28 = 1 << ((char)local_2ac + 8U & 0x1f) | *local_28;
      if (local_2b0 < 1) {
        local_2b0 = -local_2b0;
      }
    }
    *local_28 = local_2b0 << ((byte)(local_2ac << 1) & 0x1f) | *local_28;
    local_2ac = local_2ac + 1;
  }
  return false;
}

Assistant:

bool MipsParser::parseVpfxdParameter(Parser& parser, int& result)
{
	static TokenSequenceParser sequenceParser;

	// initialize on first use
	if (sequenceParser.getEntryCount() == 0)
	{
		// 0-1
		sequenceParser.addEntry(1,
			{TokenType::Integer, TokenType::Minus, TokenType::Integer},
			{INT64_C(0), INT64_C(1)} );
		// 0-1
		sequenceParser.addEntry(-1,
			{TokenType::Integer, TokenType::Minus, TokenType::NumberString},
			{INT64_C(0), "1m"} );
		// 0:1
		sequenceParser.addEntry(1,
			{TokenType::Integer, TokenType::Colon, TokenType::Integer},
			{INT64_C(0), INT64_C(1)} );
		// 0:1
		sequenceParser.addEntry(-1,
			{TokenType::Integer, TokenType::Colon, TokenType::NumberString},
			{INT64_C(0), "1m"} );
		// -1-1
		sequenceParser.addEntry(3,
			{TokenType::Minus, TokenType::Integer, TokenType::Minus, TokenType::Integer},
			{INT64_C(1), INT64_C(1)} );
		// -1-1m
		sequenceParser.addEntry(-3,
			{TokenType::Minus, TokenType::Integer, TokenType::Minus, TokenType::NumberString},
			{INT64_C(1), "1m"} );
		// -1:1
		sequenceParser.addEntry(3,
			{TokenType::Minus, TokenType::Integer, TokenType::Colon, TokenType::Integer},
			{INT64_C(1), INT64_C(1)} );
		// -1:1m
		sequenceParser.addEntry(-3,
			{TokenType::Minus, TokenType::Integer, TokenType::Colon, TokenType::NumberString},
			{INT64_C(1), "1m"} );
	}

	for (int i = 0; i < 4; i++)
	{
		if (i != 0)
		{
			if (parser.nextToken().type != TokenType::Comma)
				return false;
		}

		parser.eatToken();
		
		int num = 0;
		if (!sequenceParser.parse(parser,num))
			return false;

		// m versions
		if (num < 0)
		{
			result |= 1 << (8+i);
			num = abs(num);
		}

		result |= num << (2*i);
	}
	
	return parser.nextToken().type == TokenType::RBrack;
}